

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     outs<unsigned_char,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,uint16_t port,
               unsigned_short *eSI,Context *context)

{
  Segments *pSVar1;
  byte bVar2;
  
  bVar2 = (byte)(instruction->source_data_dest_sib_ >> 10) & 7 | 8;
  pSVar1 = (context->memory).segments_;
  if (bVar2 != 8) {
    if (bVar2 == 9) {
      pSVar1 = (Segments *)&pSVar1->cs_base_;
    }
    else if (bVar2 == 10) {
      pSVar1 = (Segments *)&pSVar1->ss_base_;
    }
    else {
      pSVar1 = (Segments *)&pSVar1->ds_base_;
    }
  }
  PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::out<unsigned_char>
            (&context->io,port,
             (context->memory).memory._M_elems[(uint)*eSI + pSVar1->es_base_ & 0xfffff]);
  *eSI = *eSI + (short)(context->flags).direction_;
  return;
}

Assistant:

void outs(
	const InstructionT &instruction,
	AddressT &eCX,
	uint16_t port,
	AddressT &eSI,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	context.io.template out<IntT>(
		port,
		context.memory.template access<IntT, AccessType::Read>(instruction.data_segment(), eSI)
	);
	eSI += context.flags.template direction<AddressT>() * sizeof(IntT);

	repeat<AddressT, repetition>(eCX, context);
}